

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int ARKodeSetJacEvalFrequency(void *arkode_mem,long msbj)

{
  long lVar1;
  long lVar2;
  int line;
  int iVar3;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar3 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x2f9;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x128) != 0) {
      lVar1 = (**(code **)((long)arkode_mem + 0x140))(arkode_mem);
      if (lVar1 != 0) {
        lVar2 = 0x33;
        if (0 < msbj) {
          lVar2 = msbj;
        }
        *(long *)(lVar1 + 0x70) = lVar2;
        return 0;
      }
      arkProcessError((ARKodeMem)arkode_mem,-2,0xff8,"ARKodeSetJacEvalFrequency",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                      ,"Linear solver memory is NULL.");
      return -2;
    }
    msgfmt = "time-stepping module does not require an algebraic solver";
    iVar3 = -0x30;
    error_code = -0x30;
    line = 0x302;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeSetJacEvalFrequency",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int ARKodeSetJacEvalFrequency(void* arkode_mem, long int msbj)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* store input and return */
  arkls_mem->msbj = (msbj <= 0) ? ARKLS_MSBJ : msbj;

  return (ARKLS_SUCCESS);
}